

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O0

void __thiscall Assimp::DXF::PolyLine::PolyLine(PolyLine *this,PolyLine *param_1)

{
  PolyLine *param_1_local;
  PolyLine *this_local;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->positions,&param_1->positions);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            (&this->colors,&param_1->colors);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->indices,&param_1->indices)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->counts,&param_1->counts);
  this->flags = param_1->flags;
  std::__cxx11::string::string((string *)&this->layer,(string *)&param_1->layer);
  std::__cxx11::string::string((string *)&this->desc,(string *)&param_1->desc);
  return;
}

Assistant:

PolyLine()
    : flags() {
        // empty
    }